

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

void ts_subtree_set_children
               (MutableSubtree self,Subtree *children,uint32_t child_count,TSLanguage *language)

{
  Subtree SVar1;
  Subtree self_00;
  _Bool _Var2;
  TSSymbolMetadata TVar3;
  TSSymbol TVar4;
  TSStateId TVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  int32_t iVar9;
  uint32_t uVar10;
  TSSymbol *pTVar11;
  Length LVar12;
  Subtree last_child;
  Subtree first_child;
  uint32_t grandchild_count;
  Subtree child_1;
  uint32_t i_1;
  undefined4 uStack_e0;
  uint32_t child_lookahead_end_byte;
  uint32_t local_d8;
  undefined8 local_88;
  uint32_t local_80;
  undefined8 local_68;
  uint32_t local_60;
  Subtree child;
  uint32_t i;
  uint32_t lookahead_end_byte;
  TSSymbol *alias_sequence;
  uint32_t non_extra_index;
  TSLanguage *language_local;
  uint32_t child_count_local;
  Subtree *children_local;
  MutableSubtree self_local;
  
  if (((ulong)self.ptr & 1) == 0) {
    if (((self.ptr)->child_count != 0) && (children != ((self.ptr)->field_17).field_0.children)) {
      ts_free(((self.ptr)->field_17).field_0.children);
    }
    (self.ptr)->child_count = child_count;
    ((self.ptr)->field_17).field_0.children = children;
    ((self.ptr)->field_17).field_0.named_child_count = 0;
    ((self.ptr)->field_17).field_0.visible_child_count = 0;
    (self.ptr)->error_cost = 0;
    ((self.ptr)->field_17).field_0.repeat_depth = 0;
    ((self.ptr)->field_17).field_0.node_count = 1;
    *(ushort *)&(self.ptr)->field_0x2c = *(ushort *)&(self.ptr)->field_0x2c & 0xffbf;
    ((self.ptr)->field_17).field_0.dynamic_precedence = 0;
    alias_sequence._4_4_ = 0;
    pTVar11 = ts_language_alias_sequence
                        (language,(uint)((self.ptr)->field_17).field_0.alias_sequence_id);
    child._4_4_ = 0;
    for (child._0_4_ = 0; (uint)child._0_4_ < (self.ptr)->child_count; child._0_4_ = child._0_4_ + 1
        ) {
      SVar1 = ((self.ptr)->field_17).field_0.children[(uint)child._0_4_];
      if (child._0_4_ == 0) {
        LVar12 = ts_subtree_padding(SVar1);
        local_60 = LVar12.extent.column;
        local_68 = LVar12._0_8_;
        ((self.ptr)->padding).extent.column = local_60;
        ((Length *)((long)self + 4))->bytes = (undefined4)local_68;
        (((Length *)((long)self + 4))->extent).row = local_68._4_4_;
        LVar12 = ts_subtree_size(SVar1);
        local_88 = LVar12._0_8_;
        local_80 = LVar12.extent.column;
        ((Length *)((long)self + 0x10))->bytes = (undefined4)local_88;
        (((Length *)((long)self + 0x10))->extent).row = local_88._4_4_;
        ((self.ptr)->size).extent.column = local_80;
      }
      else {
        LVar12 = ts_subtree_total_size(SVar1);
        LVar12 = length_add((self.ptr)->size,LVar12);
        _uStack_e0 = LVar12._0_8_;
        local_d8 = LVar12.extent.column;
        ((Length *)((long)self + 0x10))->bytes = uStack_e0;
        (((Length *)((long)self + 0x10))->extent).row = child_lookahead_end_byte;
        ((self.ptr)->size).extent.column = local_d8;
      }
      uVar8 = ((self.ptr)->padding).bytes;
      uVar10 = ((self.ptr)->size).bytes;
      uVar6 = ts_subtree_lookahead_bytes(SVar1);
      uVar7 = uVar8 + uVar10 + uVar6;
      if ((uint)child._4_4_ < uVar7) {
        child._4_4_ = uVar7;
      }
      TVar4 = ts_subtree_symbol(SVar1);
      if (TVar4 != 0xfffe) {
        uVar8 = ts_subtree_error_cost(SVar1);
        (self.ptr)->error_cost = uVar8 + (self.ptr)->error_cost;
      }
      iVar9 = ts_subtree_dynamic_precedence(SVar1);
      ((self.ptr)->field_17).field_0.dynamic_precedence =
           iVar9 + ((self.ptr)->field_17).field_0.dynamic_precedence;
      uVar8 = ts_subtree_node_count(SVar1);
      ((self.ptr)->field_17).field_0.node_count = uVar8 + ((self.ptr)->field_17).field_0.node_count;
      if (((pTVar11 == (TSSymbol *)0x0) || (pTVar11[alias_sequence._4_4_] == 0)) ||
         (_Var2 = ts_subtree_extra(SVar1), _Var2)) {
        _Var2 = ts_subtree_visible(SVar1);
        if (_Var2) {
          ((self.ptr)->field_17).field_0.visible_child_count =
               ((self.ptr)->field_17).field_0.visible_child_count + 1;
          _Var2 = ts_subtree_named(SVar1);
          if (_Var2) {
            ((self.ptr)->field_17).field_0.named_child_count =
                 ((self.ptr)->field_17).field_0.named_child_count + 1;
          }
        }
        else {
          uVar8 = ts_subtree_child_count(SVar1);
          if (uVar8 != 0) {
            ((self.ptr)->field_17).field_0.visible_child_count =
                 ((SVar1.ptr)->field_17).field_0.visible_child_count +
                 ((self.ptr)->field_17).field_0.visible_child_count;
            ((self.ptr)->field_17).field_0.named_child_count =
                 ((SVar1.ptr)->field_17).field_0.named_child_count +
                 ((self.ptr)->field_17).field_0.named_child_count;
          }
        }
      }
      else {
        ((self.ptr)->field_17).field_0.visible_child_count =
             ((self.ptr)->field_17).field_0.visible_child_count + 1;
        TVar3 = ts_language_symbol_metadata(language,pTVar11[alias_sequence._4_4_]);
        if (((byte)TVar3 >> 1 & 1) != 0) {
          ((self.ptr)->field_17).field_0.named_child_count =
               ((self.ptr)->field_17).field_0.named_child_count + 1;
        }
      }
      _Var2 = ts_subtree_has_external_tokens(SVar1);
      if (_Var2) {
        *(ushort *)&(self.ptr)->field_0x2c = *(ushort *)&(self.ptr)->field_0x2c & 0xffbf | 0x40;
      }
      _Var2 = ts_subtree_is_error(SVar1);
      if (_Var2) {
        *(ushort *)&(self.ptr)->field_0x2c = *(ushort *)&(self.ptr)->field_0x2c & 0xffef | 0x10;
        *(ushort *)&(self.ptr)->field_0x2c = *(ushort *)&(self.ptr)->field_0x2c & 0xfff7 | 8;
        (self.ptr)->parse_state = TS_TREE_STATE_NONE;
      }
      _Var2 = ts_subtree_extra(SVar1);
      if (!_Var2) {
        alias_sequence._4_4_ = alias_sequence._4_4_ + 1;
      }
    }
    (self.ptr)->lookahead_bytes =
         (child._4_4_ - ((self.ptr)->size).bytes) - ((self.ptr)->padding).bytes;
    if (((self.ptr)->symbol == 0xffff) || ((self.ptr)->symbol == 0xfffe)) {
      (self.ptr)->error_cost =
           ((self.ptr)->size).bytes + 500 + ((self.ptr)->size).extent.row * 0x1e +
           (self.ptr)->error_cost;
      for (child_1._4_4_ = 0; (uint)child_1._4_4_ < (self.ptr)->child_count;
          child_1._4_4_ = child_1._4_4_ + 1) {
        SVar1 = ((self.ptr)->field_17).field_0.children[(uint)child_1._4_4_];
        uVar8 = ts_subtree_child_count(SVar1);
        _Var2 = ts_subtree_extra(SVar1);
        if ((!_Var2) && ((_Var2 = ts_subtree_is_error(SVar1), !_Var2 || (uVar8 != 0)))) {
          _Var2 = ts_subtree_visible(SVar1);
          if (_Var2) {
            (self.ptr)->error_cost = (self.ptr)->error_cost + 100;
          }
          else if (uVar8 != 0) {
            (self.ptr)->error_cost =
                 ((SVar1.ptr)->field_17).field_0.visible_child_count * 100 + (self.ptr)->error_cost;
          }
        }
      }
    }
    if ((self.ptr)->child_count != 0) {
      SVar1 = *((self.ptr)->field_17).field_0.children;
      self_00 = ((self.ptr)->field_17).field_0.children[(self.ptr)->child_count - 1];
      TVar4 = ts_subtree_leaf_symbol(SVar1);
      ((self.ptr)->field_17).field_0.first_leaf.symbol = TVar4;
      TVar5 = ts_subtree_leaf_parse_state(SVar1);
      ((self.ptr)->field_17).field_0.first_leaf.parse_state = TVar5;
      _Var2 = ts_subtree_fragile_left(SVar1);
      if (_Var2) {
        *(ushort *)&(self.ptr)->field_0x2c = *(ushort *)&(self.ptr)->field_0x2c & 0xfff7 | 8;
      }
      _Var2 = ts_subtree_fragile_right(self_00);
      if (_Var2) {
        *(ushort *)&(self.ptr)->field_0x2c = *(ushort *)&(self.ptr)->field_0x2c & 0xffef | 0x10;
      }
      if ((((1 < (self.ptr)->child_count) && ((*(ushort *)&(self.ptr)->field_0x2c & 1) == 0)) &&
          ((*(ushort *)&(self.ptr)->field_0x2c >> 1 & 1) == 0)) &&
         (TVar4 = ts_subtree_symbol(SVar1), TVar4 == (self.ptr)->symbol)) {
        uVar8 = ts_subtree_repeat_depth(SVar1);
        uVar10 = ts_subtree_repeat_depth(self_00);
        if (uVar10 < uVar8) {
          uVar8 = ts_subtree_repeat_depth(SVar1);
          ((self.ptr)->field_17).field_0.repeat_depth = uVar8 + 1;
        }
        else {
          uVar8 = ts_subtree_repeat_depth(self_00);
          ((self.ptr)->field_17).field_0.repeat_depth = uVar8 + 1;
        }
      }
    }
    return;
  }
  __assert_fail("!self.data.is_inline",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/subtree.c"
                ,0x15b,
                "void ts_subtree_set_children(MutableSubtree, Subtree *, uint32_t, const TSLanguage *)"
               );
}

Assistant:

void ts_subtree_set_children(
  MutableSubtree self, Subtree *children, uint32_t child_count, const TSLanguage *language
) {
  assert(!self.data.is_inline);

  if (self.ptr->child_count > 0 && children != self.ptr->children) {
    ts_free(self.ptr->children);
  }

  self.ptr->child_count = child_count;
  self.ptr->children = children;
  self.ptr->named_child_count = 0;
  self.ptr->visible_child_count = 0;
  self.ptr->error_cost = 0;
  self.ptr->repeat_depth = 0;
  self.ptr->node_count = 1;
  self.ptr->has_external_tokens = false;
  self.ptr->dynamic_precedence = 0;

  uint32_t non_extra_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
  uint32_t lookahead_end_byte = 0;

  for (uint32_t i = 0; i < self.ptr->child_count; i++) {
    Subtree child = self.ptr->children[i];

    if (i == 0) {
      self.ptr->padding = ts_subtree_padding(child);
      self.ptr->size = ts_subtree_size(child);
    } else {
      self.ptr->size = length_add(self.ptr->size, ts_subtree_total_size(child));
    }

    uint32_t child_lookahead_end_byte =
      self.ptr->padding.bytes +
      self.ptr->size.bytes +
      ts_subtree_lookahead_bytes(child);
    if (child_lookahead_end_byte > lookahead_end_byte) lookahead_end_byte = child_lookahead_end_byte;

    if (ts_subtree_symbol(child) != ts_builtin_sym_error_repeat) {
      self.ptr->error_cost += ts_subtree_error_cost(child);
    }

    self.ptr->dynamic_precedence += ts_subtree_dynamic_precedence(child);
    self.ptr->node_count += ts_subtree_node_count(child);

    if (alias_sequence && alias_sequence[non_extra_index] != 0 && !ts_subtree_extra(child)) {
      self.ptr->visible_child_count++;
      if (ts_language_symbol_metadata(language, alias_sequence[non_extra_index]).named) {
        self.ptr->named_child_count++;
      }
    } else if (ts_subtree_visible(child)) {
      self.ptr->visible_child_count++;
      if (ts_subtree_named(child)) self.ptr->named_child_count++;
    } else if (ts_subtree_child_count(child) > 0) {
      self.ptr->visible_child_count += child.ptr->visible_child_count;
      self.ptr->named_child_count += child.ptr->named_child_count;
    }

    if (ts_subtree_has_external_tokens(child)) self.ptr->has_external_tokens = true;

    if (ts_subtree_is_error(child)) {
      self.ptr->fragile_left = self.ptr->fragile_right = true;
      self.ptr->parse_state = TS_TREE_STATE_NONE;
    }

    if (!ts_subtree_extra(child)) non_extra_index++;
  }

  self.ptr->lookahead_bytes = lookahead_end_byte - self.ptr->size.bytes - self.ptr->padding.bytes;

  if (self.ptr->symbol == ts_builtin_sym_error || self.ptr->symbol == ts_builtin_sym_error_repeat) {
    self.ptr->error_cost +=
      ERROR_COST_PER_RECOVERY +
      ERROR_COST_PER_SKIPPED_CHAR * self.ptr->size.bytes +
      ERROR_COST_PER_SKIPPED_LINE * self.ptr->size.extent.row;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      uint32_t grandchild_count = ts_subtree_child_count(child);
      if (ts_subtree_extra(child)) continue;
      if (ts_subtree_is_error(child) && grandchild_count == 0) continue;
      if (ts_subtree_visible(child)) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE;
      } else if (grandchild_count > 0) {
        self.ptr->error_cost += ERROR_COST_PER_SKIPPED_TREE * child.ptr->visible_child_count;
      }
    }
  }

  if (self.ptr->child_count > 0) {
    Subtree first_child = self.ptr->children[0];
    Subtree last_child = self.ptr->children[self.ptr->child_count - 1];

    self.ptr->first_leaf.symbol = ts_subtree_leaf_symbol(first_child);
    self.ptr->first_leaf.parse_state = ts_subtree_leaf_parse_state(first_child);

    if (ts_subtree_fragile_left(first_child)) self.ptr->fragile_left = true;
    if (ts_subtree_fragile_right(last_child)) self.ptr->fragile_right = true;

    if (
      self.ptr->child_count >= 2 &&
      !self.ptr->visible &&
      !self.ptr->named &&
      ts_subtree_symbol(first_child) == self.ptr->symbol
    ) {
      if (ts_subtree_repeat_depth(first_child) > ts_subtree_repeat_depth(last_child)) {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(first_child) + 1;
      } else {
        self.ptr->repeat_depth = ts_subtree_repeat_depth(last_child) + 1;
      }
    }
  }
}